

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void TextAlign(TidyDocImpl *doc,Node *node)

{
  AttVal *local_28;
  AttVal *prev;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_28 = (AttVal *)0x0;
  prev = node->attributes;
  while( true ) {
    if (prev == (AttVal *)0x0) {
      return;
    }
    if (((prev != (AttVal *)0x0) && (prev->dict != (Attribute *)0x0)) &&
       (prev->dict->id == TidyAttr_ALIGN)) break;
    local_28 = prev;
    prev = prev->next;
  }
  if (local_28 == (AttVal *)0x0) {
    node->attributes = prev->next;
  }
  else {
    local_28->next = prev->next;
  }
  if (prev->value != (tmbstr)0x0) {
    AddAlign(doc,node,prev->value);
  }
  prvTidyFreeAttribute(doc,prev);
  return;
}

Assistant:

static void TextAlign( TidyDocImpl* doc, Node* node )
{
    AttVal *av, *prev;

    prev = NULL;

    for (av = node->attributes; av; av = av->next)
    {
        if (attrIsALIGN(av))
        {
            if (prev)
                prev->next = av->next;
            else
                node->attributes = av->next;

            if (av->value)
                AddAlign( doc, node, av->value );

            TY_(FreeAttribute)(doc, av);
            break;
        }

        prev = av;
    }
}